

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindProgramCommand.cxx
# Opt level: O3

string * __thiscall
cmFindProgramCommand::FindProgram_abi_cxx11_
          (string *__return_storage_ptr__,cmFindProgramCommand *this)

{
  string local_40;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (((this->super_cmFindBase).super_cmFindCommon.SearchAppBundleFirst != false) ||
     ((this->super_cmFindBase).super_cmFindCommon.SearchAppBundleOnly == true)) {
    FindAppBundle_abi_cxx11_(&local_40,this);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    if (__return_storage_ptr__->_M_string_length != 0) {
      return __return_storage_ptr__;
    }
  }
  if ((this->super_cmFindBase).super_cmFindCommon.SearchAppBundleOnly == false) {
    FindNormalProgram_abi_cxx11_(&local_40,this);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    if (__return_storage_ptr__->_M_string_length != 0) {
      return __return_storage_ptr__;
    }
  }
  if ((this->super_cmFindBase).super_cmFindCommon.SearchAppBundleLast == true) {
    FindAppBundle_abi_cxx11_(&local_40,this);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmFindProgramCommand::FindProgram()
{
  std::string program;

  if (this->SearchAppBundleFirst || this->SearchAppBundleOnly) {
    program = this->FindAppBundle();
  }
  if (program.empty() && !this->SearchAppBundleOnly) {
    program = this->FindNormalProgram();
  }

  if (program.empty() && this->SearchAppBundleLast) {
    program = this->FindAppBundle();
  }
  return program;
}